

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionHandler::handleExpr<acto::actor_ref_const&>
          (AssertionHandler *this,ExprLhs<const_acto::actor_ref_&> *expr)

{
  UnaryExpr<const_acto::actor_ref_&> local_30;
  ExprLhs<const_acto::actor_ref_&> *local_18;
  ExprLhs<const_acto::actor_ref_&> *expr_local;
  AssertionHandler *this_local;
  
  local_18 = expr;
  expr_local = (ExprLhs<const_acto::actor_ref_&> *)this;
  ExprLhs<const_acto::actor_ref_&>::makeUnaryExpr(&local_30,expr);
  handleExpr(this,&local_30.super_ITransientExpression);
  UnaryExpr<const_acto::actor_ref_&>::~UnaryExpr(&local_30);
  return;
}

Assistant:

void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }